

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLookupResultValid
               (Texture2DArrayView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FilterMode FVar6;
  bool bVar7;
  int iVar8;
  int coordZ;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vec2 coordXY;
  Vec2 local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  Vec2 local_38;
  
  if (texture->m_numLevels < 1) {
    iVar9 = -1;
  }
  else {
    iVar9 = (texture->m_levels->m_size).m_data[2] + -1;
  }
  fVar13 = coord->m_data[2];
  fVar11 = TexVerifierUtil::computeFloatingPointError(fVar13,(prec->coordBits).m_data[2]);
  fVar12 = floorf((fVar13 - fVar11) + 0.5);
  iVar8 = (int)fVar12;
  fVar13 = ceilf(fVar13 + fVar11 + 0.5);
  iVar3 = (int)fVar13 + -1;
  coordZ = iVar9;
  if (iVar8 < iVar9) {
    coordZ = iVar8;
  }
  if (iVar8 < 0) {
    coordZ = 0;
  }
  if (iVar3 < iVar9) {
    iVar9 = iVar3;
  }
  if (iVar3 < 0) {
    iVar9 = 0;
  }
  local_50.m_data = *(float (*) [2])coord->m_data;
  bVar7 = coordZ <= iVar9;
  if (coordZ <= iVar9) {
    fVar13 = lodBounds->m_data[0];
    fVar11 = lodBounds->m_data[1];
    fVar12 = sampler->lodThreshold;
    fVar14 = ceilf(fVar13 + 0.5);
    local_44 = (int)fVar14 + -1;
    fVar14 = floorf(fVar11 + 0.5);
    local_48 = (int)fVar14;
    fVar14 = floorf(fVar13);
    local_3c = (int)fVar14;
    fVar14 = floorf(fVar11);
    local_40 = (int)fVar14;
    do {
      if ((fVar13 <= fVar12) &&
         (bVar1 = isLevelSampleResultValid
                            (texture->m_levels,sampler,sampler->magFilter,prec,&local_50,coordZ,
                             result), bVar1)) {
        return bVar7;
      }
      if (fVar12 < fVar11) {
        FVar6 = sampler->minFilter;
        iVar3 = texture->m_numLevels + -1;
        if (iVar3 < 1 || (FVar6 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
          if ((FVar6 == LINEAR_MIPMAP_NEAREST) || (FVar6 == NEAREST_MIPMAP_NEAREST)) {
            iVar8 = iVar3;
            if (local_44 < iVar3) {
              iVar8 = local_44;
            }
            iVar5 = 0;
            if (local_44 < 0) {
              iVar8 = iVar5;
            }
            if (local_48 < iVar3) {
              iVar3 = local_48;
            }
            if (local_48 < 0) {
              iVar3 = 0;
            }
            bVar1 = iVar3 < iVar8;
            if (iVar8 <= iVar3) {
              do {
                uVar4 = sampler->minFilter - LINEAR;
                FVar6 = NEAREST;
                if (uVar4 < 5) {
                  FVar6 = *(FilterMode *)(&DAT_00bc26d8 + (ulong)uVar4 * 4);
                }
                bVar2 = isLevelSampleResultValid
                                  (texture->m_levels + iVar8,sampler,FVar6,prec,&local_50,coordZ,
                                   result);
                if (bVar2) {
                  iVar5 = 1;
                  goto LAB_00ab89ff;
                }
                iVar8 = iVar8 + 1;
                bVar1 = iVar3 < iVar8;
              } while (iVar8 <= iVar3);
              iVar5 = 0;
            }
LAB_00ab89ff:
            if (bVar1) goto LAB_00ab89b2;
          }
          else {
            bVar1 = isLevelSampleResultValid
                              (texture->m_levels,sampler,FVar6,prec,&local_50,coordZ,result);
            iVar5 = 1;
            if (!bVar1) {
LAB_00ab89b2:
              iVar5 = 0;
            }
          }
        }
        else {
          iVar8 = texture->m_numLevels + -2;
          iVar3 = iVar8;
          if (local_3c < iVar8) {
            iVar3 = local_3c;
          }
          if (local_3c < 0) {
            iVar3 = 0;
          }
          if (local_40 < iVar8) {
            iVar8 = local_40;
          }
          if (local_40 < 0) {
            iVar8 = 0;
          }
          do {
            iVar10 = iVar3;
            if (iVar8 < iVar10) {
              iVar5 = 0;
              goto LAB_00ab89a8;
            }
            uVar4 = sampler->minFilter - LINEAR;
            FVar6 = NEAREST;
            if (uVar4 < 5) {
              FVar6 = *(FilterMode *)(&DAT_00bc26d8 + (ulong)uVar4 * 4);
            }
            fVar14 = fVar13 - (float)iVar10;
            local_38.m_data[0] = 1.0;
            if (fVar14 <= 1.0) {
              local_38.m_data[0] = fVar14;
            }
            local_38.m_data[0] = (float)(~-(uint)(fVar14 < 0.0) & (uint)local_38.m_data[0]);
            fVar14 = fVar11 - (float)iVar10;
            local_38.m_data[1] = 1.0;
            if (fVar14 <= 1.0) {
              local_38.m_data[1] = fVar14;
            }
            local_38.m_data[1] = (float)(~-(uint)(fVar14 < 0.0) & (uint)local_38.m_data[1]);
            bVar1 = isMipmapLinearSampleResultValid
                              (texture->m_levels + iVar10,texture->m_levels + (iVar10 + 1),sampler,
                               FVar6,prec,&local_50,coordZ,&local_38,result);
            iVar3 = iVar10 + 1;
          } while (!bVar1);
          iVar5 = 1;
LAB_00ab89a8:
          if (iVar8 < iVar10) goto LAB_00ab89b2;
        }
        if (iVar5 != 0) {
          return bVar7;
        }
      }
      coordZ = coordZ + 1;
      bVar7 = coordZ <= iVar9;
    } while (coordZ <= iVar9);
  }
  return bVar7;
}

Assistant:

bool isLookupResultValid (const Texture2DArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2		layerRange		= computeLayerRange(texture.getNumLayers(), prec.coordBits.z(), coord.z());
	const Vec2		coordXY			= coord.swizzle(0,1);
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = layerRange.x(); layer <= layerRange.y(); layer++)
	{
		if (canBeMagnified)
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coordXY, layer, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coordXY, layer, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coordXY, layer, result))
						return true;
				}
			}
			else
			{
				if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coordXY, layer, result))
					return true;
			}
		}
	}

	return false;
}